

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strxfrm.c
# Opt level: O0

size_t strxfrm(char *__dest,char *__src,size_t __n)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  size_t len;
  size_t n_local;
  char *s2_local;
  char *s1_local;
  
  sVar2 = strlen(__src);
  len = __n;
  n_local = (size_t)__src;
  s2_local = __dest;
  if (sVar2 < __n) {
    do {
      bVar3 = false;
      if (len != 0) {
        cVar1 = *(char *)n_local;
        *s2_local = cVar1;
        bVar3 = cVar1 != '\0';
        n_local = n_local + 1;
        s2_local = s2_local + 1;
      }
      len = len - 1;
    } while (bVar3);
  }
  return sVar2;
}

Assistant:

size_t strxfrm( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2, size_t n )
{
    size_t len = strlen( s2 );

    if ( len < n )
    {
        /* Cannot use strncpy() here as the filling of s1 with '\0' is not part
           of the spec.
        */
        /* FIXME: This should access _PDCLIB_lc_collate. */
        while ( n-- && ( *s1++ = ( unsigned char )*s2++ ) )
        {
            /* EMPTY */
        }
    }

    return len;
}